

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_mri_tables.c
# Opt level: O2

MRIStepCoupling MRIStepCoupling_MIStoMRI(ARKodeButcherTable B,int q,int p)

{
  double *pdVar1;
  uint uVar2;
  uint uVar3;
  realtype *prVar4;
  realtype ***ppprVar5;
  bool bVar6;
  uint stages;
  bool bVar7;
  MRIStepCoupling pMVar8;
  ulong uVar9;
  long lVar10;
  long lVar11;
  ulong uVar12;
  MRISTEP_METHOD_TYPE MVar13;
  ulong uVar14;
  ulong uVar15;
  long lVar16;
  MRISTEP_METHOD_TYPE type;
  double dVar17;
  
  uVar12 = 0;
  if (B != (ARKodeButcherTable)0x0) {
    prVar4 = B->c;
    dVar17 = ABS(*prVar4);
    uVar2 = B->stages;
    lVar16 = (long)(int)uVar2;
    uVar9 = 0;
    if (0 < (int)uVar2) {
      uVar9 = (ulong)uVar2;
    }
    for (; uVar9 != uVar12; uVar12 = uVar12 + 1) {
      dVar17 = dVar17 + ABS((*B->A)[uVar12]);
    }
    if ((dVar17 <= 2.220446049250313e-14) && (prVar4[lVar16 + -1] <= 1.0000000000000222)) {
      lVar10 = 1;
      while (lVar10 < lVar16) {
        pdVar1 = prVar4 + lVar10;
        lVar11 = lVar10 + -1;
        lVar10 = lVar10 + 1;
        if (*pdVar1 - prVar4[lVar11] < -2.220446049250313e-14) {
          return (MRIStepCoupling)0x0;
        }
      }
      dVar17 = 0.0;
      lVar10 = 1;
      for (uVar12 = 0; lVar11 = lVar10, uVar12 != uVar9; uVar12 = uVar12 + 1) {
        for (; (int)lVar11 < (int)uVar2; lVar11 = lVar11 + 1) {
          dVar17 = dVar17 + ABS(B->A[uVar12][lVar11]);
        }
        lVar10 = lVar10 + 1;
      }
      if (dVar17 <= 2.220446049250313e-14) {
        bVar6 = 2.220446049250313e-14 < ABS(prVar4[lVar16 + -1] + -1.0);
        for (uVar12 = 0; uVar9 != uVar12; uVar12 = uVar12 + 1) {
          bVar7 = true;
          if (ABS(B->A[lVar16 + -1][uVar12] - B->b[uVar12]) <= 2.220446049250313e-14) {
            bVar7 = bVar6;
          }
          bVar6 = bVar7;
        }
        type = MRISTEP_EXPLICIT;
        for (uVar12 = 0; uVar14 = uVar12, uVar12 != uVar9; uVar12 = uVar12 + 1) {
          for (; uVar2 != uVar14; uVar14 = uVar14 + 1) {
            MVar13 = MRISTEP_IMPLICIT;
            if (ABS(B->A[uVar12][uVar14]) <= 2.220446049250313e-14) {
              MVar13 = type;
            }
            type = MVar13;
          }
        }
        stages = uVar2 + 1;
        if (!bVar6) {
          stages = uVar2;
        }
        pMVar8 = MRIStepCoupling_Alloc(1,stages,type);
        uVar12 = 0;
        if (pMVar8 != (MRIStepCoupling)0x0) {
          pMVar8->q = q;
          pMVar8->p = p;
          uVar3 = B->stages;
          uVar9 = 0;
          if (0 < (int)uVar3) {
            uVar9 = (ulong)uVar3;
          }
          for (; uVar9 != uVar12; uVar12 = uVar12 + 1) {
            pMVar8->c[uVar12] = B->c[uVar12];
          }
          if (bVar6) {
            pMVar8->c[lVar16] = 1.0;
          }
          ppprVar5 = (&pMVar8->W)[type != MRISTEP_EXPLICIT];
          uVar12 = 0;
          uVar14 = 0;
          if (0 < (int)stages) {
            uVar14 = (ulong)stages;
          }
          for (; uVar12 != uVar14; uVar12 = uVar12 + 1) {
            for (uVar15 = 0; stages != uVar15; uVar15 = uVar15 + 1) {
              (*ppprVar5)[uVar12][uVar15] = 0.0;
            }
          }
          for (lVar16 = 1; lVar16 < (int)uVar3; lVar16 = lVar16 + 1) {
            for (uVar12 = 0; uVar3 != uVar12; uVar12 = uVar12 + 1) {
              (*ppprVar5)[lVar16][uVar12] = B->A[lVar16][uVar12] - B->A[lVar16 + -1][uVar12];
            }
          }
          if (bVar6) {
            for (uVar12 = 0; uVar9 != uVar12; uVar12 = uVar12 + 1) {
              (*ppprVar5)[(long)(int)(uVar2 + 1) + -1][uVar12] =
                   B->b[uVar12] - B->A[(long)(int)uVar3 + -1][uVar12];
            }
            return pMVar8;
          }
          return pMVar8;
        }
      }
    }
  }
  return (MRIStepCoupling)0x0;
}

Assistant:

MRIStepCoupling MRIStepCoupling_MIStoMRI(ARKodeButcherTable B,
                                         int q, int p)
{
  int i, j, stages;
  booleantype padding;
  realtype Asum;
  realtype ***C;
  MRISTEP_METHOD_TYPE type;
  MRIStepCoupling MRIC;

  const realtype tol = RCONST(100.0) * UNIT_ROUNDOFF;

  /* Check that input table is non-NULL */
  if (!B) return(NULL);

  /* -----------------------------------
   * Check that the input table is valid
   * ----------------------------------- */

  /* First stage is just old solution */
  Asum = SUNRabs(B->c[0]);
  for (j=0; j<B->stages; j++)
    Asum += SUNRabs(B->A[0][j]);
  if (Asum > tol) return(NULL);

  /* Last stage exceeds 1 */
  if (B->c[B->stages-1] > ONE+tol) return(NULL);

  /* All stages are sorted */
  for (j=1; j<B->stages; j++)
    if ((B->c[j] - B->c[j-1]) < -tol) return(NULL);

  /* Each stage at most diagonally implicit */
  Asum = ZERO;
  for (i=0; i<B->stages; i++)
    for (j=i+1; j<B->stages; j++)
      Asum += SUNRabs(B->A[i][j]);
  if (Asum > tol) return(NULL);

  /* -----------------------------------------
   * determine whether the table needs padding
   * ----------------------------------------- */

  padding = SUNFALSE;

  /* Last stage time should equal 1 */
  if (SUNRabs(B->c[B->stages-1] - ONE) > tol)
    padding = SUNTRUE;

  /* Last row of A should equal b */
  for (j=0; j<B->stages; j++) {
    if (SUNRabs(B->A[B->stages-1][j] - B->b[j]) > tol)
      padding = SUNTRUE;
  }
  stages = (padding) ? B->stages+1 : B->stages;

  /* -------------------------
   * determine the method type
   * ------------------------- */

  /* Check if the table is strictly lower triangular (explicit) */
  type = MRISTEP_EXPLICIT;

  for (i=0; i<B->stages; i++)
    for (j=i; j<B->stages; j++)
      if (SUNRabs(B->A[i][j]) > tol)
        type = MRISTEP_IMPLICIT;

  /* ----------------------------
   * construct coupling structure
   * ---------------------------- */

  MRIC = MRIStepCoupling_Alloc(1, stages, type);
  if (!MRIC) return(NULL);

  /* Copy method/embedding orders */
  MRIC->q = q;
  MRIC->p = p;

  /* Copy abscissae, padding if needed */
  for (i=0; i<B->stages; i++)
    MRIC->c[i] = B->c[i];

  if (padding)
    MRIC->c[stages-1] = ONE;

  /* Construct the coupling table */
  if (type == MRISTEP_EXPLICIT)
    C = MRIC->W;
  else
    C = MRIC->G;

  /* First row is identically zero */
  for (i=0; i<stages; i++)
    for (j=0; j<stages; j++)
      C[0][i][j] = ZERO;

  /* Remaining rows = A(2:end,:) - A(1:end-1,:) */
  for (i=1; i<B->stages; i++)
    for (j=0; j<B->stages; j++)
      C[0][i][j] = B->A[i][j] - B->A[i-1][j];

  /* Padded row = b(:) - A(end,:) */
  if (padding)
    for (j=0; j<B->stages; j++)
      C[0][stages-1][j] = B->b[j] - B->A[B->stages-1][j];

  return(MRIC);
}